

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteNL
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this,
          string *namebase)

{
  pointer pcVar1;
  NLUtils *pNVar2;
  FILE *__stream;
  int iVar3;
  int *piVar4;
  long *plVar5;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *pNVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  SuffixWriterFactory swf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fln;
  long *local_88 [2];
  long local_78 [2];
  File local_68;
  long local_60;
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar1 = (namebase->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + namebase->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  pNVar2 = (this->super_FormatterType).utils_;
  (*pNVar2->_vptr_NLUtils[2])
            (&local_68,pNVar2,&local_48,
             (ulong)((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars < 1),"wb");
  __stream = (FILE *)(this->nm).f_;
  (this->nm).f_ = local_68.f_;
  local_68.f_ = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if ((this->nm).f_ == (FILE *)0x0) {
    (this->result_).first = NLW2_WriteNL_CantOpen;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,local_48,local_40 + (long)local_48)
    ;
    std::__cxx11::string::append((char *)local_88);
    piVar4 = __errno_location();
    strerror(*piVar4);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_88);
  }
  else {
    WriteNLHeader(this);
    WriteFunctions(this);
    local_68.f_ = (FILE *)this;
    NLFeeder_Easy::
    FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::SuffixWriterFactory>
              (this->feeder_,(SuffixWriterFactory *)&local_68);
    WriteVarBounds(this);
    WriteInitialGuesses(this);
    WriteConBounds(this);
    WriteDualInitialGuesses(this);
    WriteConObjExpressions(this);
    WriteColumnSizes(this);
    WriteLinearConExpr(this);
    WriteObjGradients(this);
    iVar3 = ferror((FILE *)(this->nm).f_);
    if (iVar3 == 0) {
      (this->result_).first = NLW2_WriteNL_OK;
      goto LAB_00116e70;
    }
    (this->result_).first = NLW2_WriteNL_Failed;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,local_48,local_40 + (long)local_48)
    ;
    std::__cxx11::string::append((char *)local_88);
    piVar4 = __errno_location();
    strerror(*piVar4);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_88);
  }
  pNVar6 = (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)(plVar5 + 2);
  if ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)*plVar5 == pNVar6)
  {
    local_58._0_8_ = (pNVar6->super_FormatterType).utils_;
    local_58._8_8_ = plVar5[3];
    local_68.f_ = (FILE *)local_58;
  }
  else {
    local_58._0_8_ = (pNVar6->super_FormatterType).utils_;
    local_68.f_ = (FILE *)*plVar5;
  }
  local_60 = plVar5[1];
  *plVar5 = (long)pNVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&(this->result_).second,(string *)&local_68);
  if ((NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)local_68.f_ !=
      (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *)local_58) {
    operator_delete(local_68.f_,(ulong)((long)(_func_int ***)local_58._0_8_ + 1));
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
LAB_00116e70:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteNL(
    const std::string& namebase) {
  auto fln = namebase + ".nl";
  nm = Utils().openf(fln,
                     Hdr().num_vars<=0,     // Delete file if true
                     "wb");
  if (nm) {
    WriteNLHeader();
    WriteFunctions();
    WriteSuffixes();
    WritePLSOSConstraints();
    if (Feeder().WantBoundsFirst()) {
      WriteVarBounds();
      WriteInitialGuesses();
      WriteConBounds();
      WriteDualInitialGuesses();
    }
    WriteDefinedVariables(0);
    WriteConObjExpressions();
    if (!Feeder().WantBoundsFirst()) {
      WriteDualInitialGuesses();
      WriteInitialGuesses();
      WriteConBounds();
      WriteVarBounds();
    }
    if (Feeder().WantColumnSizes())
      WriteColumnSizes();
    WriteLinearConExpr();
    WriteObjGradients();
    WriteRandomVariables();

    if (std::ferror(nm.GetHandle())) {
      result_.first = NLW2_WriteNL_Failed;
      result_.second = fln + ": " + std::strerror(errno);
    } else
      result_.first = NLW2_WriteNL_OK;
  } else {
    result_.first = NLW2_WriteNL_CantOpen;
    result_.second = fln + ": " + std::strerror(errno);
  }
}